

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Int(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
      *this,int i)

{
  long *plVar1;
  
  plVar1 = (long *)(this->stack_).stackTop_;
  if ((this->stack_).stackEnd_ <= plVar1 + 3) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&this->stack_,1);
    plVar1 = (long *)(this->stack_).stackTop_;
  }
  (this->stack_).stackTop_ = (char *)(plVar1 + 3);
  plVar1[1] = 0;
  *(undefined4 *)(plVar1 + 2) = 0x1606;
  *plVar1 = (long)i;
  if (-1 < i) {
    *(undefined4 *)(plVar1 + 2) = 0x3e06;
  }
  return true;
}

Assistant:

bool Int(int i) { new (stack_.template Push<ValueType>()) ValueType(i); return true; }